

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O0

void cmExecuteProcessCommandAppend
               (vector<char,_std::allocator<char>_> *output,char *data,int length)

{
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  const_iterator local_28;
  int local_1c;
  char *pcStack_18;
  int length_local;
  char *data_local;
  vector<char,_std::allocator<char>_> *output_local;
  
  local_1c = length;
  pcStack_18 = data;
  data_local = (char *)output;
  local_30._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(output);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_28,
             &local_30);
  std::vector<char,std::allocator<char>>::insert<char_const*,void>
            ((vector<char,std::allocator<char>> *)output,local_28,pcStack_18,pcStack_18 + local_1c);
  return;
}

Assistant:

void cmExecuteProcessCommandAppend(std::vector<char>& output, const char* data,
                                   int length)
{
#if defined(__APPLE__)
  // HACK on Apple to work around bug with inserting at the
  // end of an empty vector.  This resulted in random failures
  // that were hard to reproduce.
  if (output.empty() && length > 0) {
    output.push_back(data[0]);
    ++data;
    --length;
  }
#endif
  output.insert(output.end(), data, data + length);
}